

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void xmlParserPrintFileContextInternal
               (xmlParserInputPtr input,xmlGenericErrorFunc channel,void *data)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *__src;
  int *len;
  uint uVar6;
  xmlChar content [81];
  int local_88 [22];
  
  if ((input != (xmlParserInputPtr)0x0) && (pbVar1 = input->cur, pbVar1 != (byte *)0x0)) {
    pbVar5 = input->base;
    __src = pbVar1;
    for (pbVar3 = pbVar1; (pbVar5 < pbVar3 && ((*pbVar3 == 0xd || (__src = pbVar3, *pbVar3 == 10))))
        ; pbVar3 = pbVar3 + -1) {
      __src = pbVar5;
    }
    if (pbVar5 < __src) {
      uVar6 = 0;
      while ((*__src != 10 && (*__src != 0xd))) {
        __src = __src + -1;
        if ((0x4e < uVar6) || (uVar6 = uVar6 + 1, __src <= pbVar5)) goto LAB_0012f26f;
      }
      if (uVar6 == 0) goto LAB_0012f2aa;
LAB_0012f26f:
      if ((*__src == 0xd) || (*__src == 10)) {
        __src = __src + 1;
      }
    }
LAB_0012f2aa:
    len = local_88;
    pbVar5 = __src;
    uVar6 = 0;
    while ((0xd < *pbVar5 || ((0x2401U >> (*pbVar5 & 0x1f) & 1) == 0))) {
      local_88[0] = *(int *)&input->end - (int)pbVar5;
      iVar2 = xmlGetUTF8Char(pbVar5,len);
      if (iVar2 < 0) break;
      if (0x50 < local_88[0] + uVar6) break;
      pbVar5 = pbVar5 + local_88[0];
      uVar6 = local_88[0] + uVar6;
    }
    memcpy(len,__src,(ulong)uVar6);
    *(undefined1 *)((long)local_88 + (ulong)uVar6) = 0;
    (*channel)(data,"%s\n",len);
    if ((int)pbVar1 != (int)__src) {
      len = local_88;
      lVar4 = 0;
      do {
        if ((int)lVar4 == 0x4f) break;
        if (*(char *)((long)local_88 + lVar4) != '\t') {
          if (*(char *)((long)local_88 + lVar4) == '\0') goto LAB_0012f363;
          *(undefined1 *)((long)local_88 + lVar4) = 0x20;
        }
        len = (int *)((long)len + 1);
        lVar4 = lVar4 + 1;
      } while ((int)pbVar1 - (int)__src != (int)lVar4);
      len = (int *)((long)local_88 + lVar4);
    }
LAB_0012f363:
    *(undefined2 *)len = 0x5e;
    (*channel)(data,"%s\n",local_88);
  }
  return;
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc channel, void *data ) {
    const xmlChar *cur, *base, *start;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if ((input == NULL) || (input->cur == NULL))
        return;

    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n < sizeof(content) - 1) && (cur > base) &&
	   (*cur != '\n') && (*cur != '\r')) {
        cur--;
        n++;
    }
    if ((n > 0) && ((*cur == '\n') || (*cur == '\r'))) {
        cur++;
    } else {
        /* skip over continuation bytes */
        while ((cur < input->cur) && ((*cur & 0xC0) == 0x80))
            cur++;
    }
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    start = cur;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') && (*(cur) != '\r')) {
        int len = input->end - cur;
        int c = xmlGetUTF8Char(cur, &len);

        if ((c < 0) || (n + len > sizeof(content)-1))
            break;
        cur += len;
	n += len;
    }
    memcpy(content, start, n);
    content[n] = 0;
    /* print out the selected text */
    channel(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    channel(data ,"%s\n", content);
}